

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCore.c
# Opt level: O0

Gia_Man_t * Cec_ManSatSweeping(Gia_Man_t *pAig,Cec_ParFra_t *pPars,int fSilent)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  abctime aVar13;
  Gia_Man_t *pGVar14;
  Cec_ManFra_t *p_00;
  Cec_ManSim_t *p_01;
  Cec_ManPat_t *pPat_00;
  abctime aVar15;
  abctime aVar16;
  Gia_Man_t *pGVar17;
  abctime aVar18;
  int local_12c;
  int local_108;
  abctime clkTotal;
  abctime clk2;
  abctime clk;
  int nMatches;
  int fTimeOut;
  int i;
  Cec_ManPat_t *pPat;
  Cec_ManSim_t *pSim;
  Cec_ManFra_t *p;
  Gia_Man_t *pTemp;
  Gia_Man_t *pSrm;
  Gia_Man_t *pIni;
  Cec_ParSim_t *pParsSim;
  Cec_ParSim_t ParsSim;
  Cec_ParSat_t *pParsSat;
  Cec_ParSat_t ParsSat;
  int fOutputResult;
  int fSilent_local;
  Cec_ParFra_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  ParsSat.fLearnCls = 0;
  ParsSim._40_8_ = &pParsSat;
  bVar3 = false;
  ParsSat.fVerbose = fSilent;
  aVar13 = Abc_Clock();
  Gia_ManRandom(1);
  pGVar14 = Gia_ManDup(pAig);
  pGVar14->pReprs = pAig->pReprs;
  pAig->pReprs = (Gia_Rpr_t *)0x0;
  pGVar14->pNexts = pAig->pNexts;
  pAig->pNexts = (int *)0x0;
  p_00 = Cec_ManFraStart(pGVar14,pPars);
  if (pPars->fDualOut != 0) {
    pPars->fColorDiff = 1;
  }
  Cec_ManSimSetDefaultParams((Cec_ParSim_t *)&pParsSim);
  pParsSim._0_4_ = pPars->nWords;
  pParsSim._4_4_ = pPars->nRounds;
  ParsSim.TimeLimit = pPars->fCheckMiter;
  ParsSim.nNonRefines = pPars->fDualOut;
  ParsSim.fConstCorr = pPars->fVerbose;
  p_01 = Cec_ManSimStart(p_00->pAig,(Cec_ParSim_t *)&pParsSim);
  Cec_ManSatSetDefaultParams((Cec_ParSat_t *)ParsSim._40_8_);
  *(int *)ParsSim._40_8_ = pPars->nBTLimit;
  *(int *)(ParsSim._40_8_ + 0x1c) = pPars->fVeryVerbose;
  pPat_00 = Cec_ManPatStart();
  pPat_00->fVerbose = pPars->fVeryVerbose;
  aVar15 = Abc_Clock();
  if ((p_00->pAig->pReprs == (Gia_Rpr_t *)0x0) &&
     ((iVar4 = Cec_ManSimClassesPrepare(p_01,-1), iVar4 != 0 ||
      (iVar4 = Cec_ManSimClassesRefine(p_01), iVar4 != 0)))) {
    Gia_ManStop(p_00->pAig);
    p_00->pAig = (Gia_Man_t *)0x0;
  }
  else {
    aVar18 = Abc_Clock();
    p_00->timeSim = (aVar18 - aVar15) + p_00->timeSim;
    for (nMatches = 1; nMatches <= pPars->nItersMax; nMatches = nMatches + 1) {
      aVar15 = Abc_Clock();
      clk._4_4_ = 0;
      if (pPars->fDualOut != 0) {
        clk._4_4_ = Gia_ManEquivSetColors(p_00->pAig,pPars->fVeryVerbose);
      }
      pGVar14 = Cec_ManFraSpecReduction(p_00);
      if (pPars->fVeryVerbose != 0) {
        Gia_ManPrintStats(pGVar14,(Gps_Par_t *)0x0);
      }
      iVar4 = Gia_ManCoNum(pGVar14);
      if (iVar4 == 0) {
        Gia_ManStop(pGVar14);
        if (p_00->pPars->fVerbose != 0) {
          Abc_Print(1,"Considered all available candidate equivalences.\n");
        }
        if ((pPars->fDualOut == 0) || (iVar4 = Gia_ManAndNum(p_00->pAig), iVar4 < 1)) break;
        if (pPars->fColorDiff == 0) {
          if (p_00->pPars->fVerbose != 0) {
            Abc_Print(1,"Switching into normal mode.\n");
          }
          pPars->fDualOut = 0;
        }
        else {
          if (p_00->pPars->fVerbose != 0) {
            Abc_Print(1,"Switching into reduced mode.\n");
          }
          pPars->fColorDiff = 0;
        }
      }
      else {
        aVar18 = Abc_Clock();
        if (pPars->fRunCSat == 0) {
          Cec_ManSatSolve(pPat_00,pGVar14,(Cec_ParSat_t *)ParsSim._40_8_);
        }
        else {
          Cec_ManSatSolveCSat(pPat_00,pGVar14,(Cec_ParSat_t *)ParsSim._40_8_);
        }
        aVar16 = Abc_Clock();
        p_00->timeSat = (aVar16 - aVar18) + p_00->timeSat;
        iVar4 = Cec_ManFraClassesUpdate(p_00,p_01,pPat_00,pGVar14);
        if (iVar4 != 0) {
          Gia_ManStop(pGVar14);
          Gia_ManStop(p_00->pAig);
          p_00->pAig = (Gia_Man_t *)0x0;
          break;
        }
        Gia_ManStop(pGVar14);
        pGVar14 = p_00->pAig;
        pGVar17 = Gia_ManEquivReduceAndRemap(pGVar14,0,ParsSim.nNonRefines);
        p_00->pAig = pGVar17;
        p_01->pAig = pGVar17;
        if (p_00->pAig == (Gia_Man_t *)0x0) {
          p_00->pAig = pGVar14;
          break;
        }
        Gia_ManStop(pGVar14);
        if (p_00->pPars->fVerbose != 0) {
          uVar5 = p_00->nAllProved;
          uVar6 = p_00->nAllDisproved;
          uVar9 = p_00->nAllFailed;
          iVar4 = Gia_ManAndNum(p_00->pAig);
          Abc_Print(1,"%3d : P =%7d. D =%7d. F =%6d. M = %7d. And =%8d. ",(ulong)(uint)nMatches,
                    (ulong)uVar5,(ulong)uVar6,(ulong)uVar9,clk._4_4_,iVar4);
          aVar18 = Abc_Clock();
          Abc_PrintTime(1,"Time",aVar18 - aVar15);
        }
        iVar4 = Gia_ManAndNum(p_00->pAig);
        if (iVar4 == 0) {
          if (p_00->pPars->fVerbose != 0) {
            Abc_Print(1,"Network after reduction is empty.\n");
          }
          break;
        }
        if ((p_00->pPars->TimeLimit != 0) &&
           (aVar15 = Abc_Clock(), (long)p_00->pPars->TimeLimit <= (aVar15 - aVar13) / 1000000)) {
          bVar3 = true;
          break;
        }
        if (p_00->nAllProved + p_00->nAllDisproved < p_00->nAllFailed) {
          if (10000 < *(int *)ParsSim._40_8_) break;
          if (pPars->fSatSweeping != 0) {
            if (p_00->pPars->fVerbose != 0) {
              Abc_Print(1,"Exceeded the limit on the number of conflicts (%d).\n",
                        (ulong)*(uint *)ParsSim._40_8_);
            }
            break;
          }
          *(int *)ParsSim._40_8_ = *(int *)ParsSim._40_8_ * 10;
          if (p_00->pPars->fVerbose != 0) {
            if (p_00->pPars->fVerbose != 0) {
              Abc_Print(1,"Increasing conflict limit to %d.\n",(ulong)*(uint *)ParsSim._40_8_);
            }
            if (ParsSat.fLearnCls != 0) {
              Gia_AigerWrite(p_00->pAig,"gia_cec_temp.aig",0,0);
              Abc_Print(1,"The result is written into file \"%s\".\n","gia_cec_temp.aig");
            }
          }
        }
        if (((pPars->fDualOut == 0) || (pPars->fColorDiff == 0)) ||
           ((iVar4 = Gia_ManAndNum(p_00->pAig), 99999 < iVar4 &&
            (9 < p_00->nAllProved + p_00->nAllDisproved)))) {
          if ((pPars->fDualOut != 0) &&
             ((iVar4 = Gia_ManAndNum(p_00->pAig), iVar4 < 20000 ||
              (p_00->nAllProved + p_00->nAllDisproved < 10)))) {
            if (p_00->pPars->fVerbose != 0) {
              Abc_Print(1,"Switching into normal mode.\n");
            }
            pPars->fColorDiff = 0;
            pPars->fDualOut = 0;
          }
        }
        else {
          if (p_00->pPars->fVerbose != 0) {
            Abc_Print(1,"Switching into reduced mode.\n");
          }
          pPars->fColorDiff = 0;
        }
      }
    }
  }
  if ((p_00->pPars->fVerbose != 0) && (p_00->pAig != (Gia_Man_t *)0x0)) {
    uVar5 = Gia_ManAndNum(pAig);
    uVar6 = Gia_ManAndNum(p_00->pAig);
    iVar4 = Gia_ManAndNum(pAig);
    iVar7 = Gia_ManAndNum(p_00->pAig);
    iVar8 = Gia_ManAndNum(pAig);
    if (iVar8 == 0) {
      local_108 = 1;
    }
    else {
      local_108 = Gia_ManAndNum(pAig);
    }
    uVar9 = Gia_ManRegNum(pAig);
    uVar10 = Gia_ManRegNum(p_00->pAig);
    iVar8 = Gia_ManRegNum(pAig);
    iVar11 = Gia_ManRegNum(p_00->pAig);
    iVar12 = Gia_ManRegNum(pAig);
    if (iVar12 == 0) {
      local_12c = 1;
    }
    else {
      local_12c = Gia_ManRegNum(pAig);
    }
    Abc_Print(1,
              "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n"
              ,((double)(iVar4 - iVar7) * 100.0) / (double)local_108,
              ((double)(iVar8 - iVar11) * 100.0) / (double)local_12c,(ulong)uVar5,(ulong)uVar6,
              (ulong)uVar9,(ulong)uVar10);
    aVar15 = p_00->timeSim;
    aVar18 = Abc_Clock();
    iVar4 = (int)aVar13;
    Abc_PrintTimeP(1,"Sim ",aVar15,aVar18 - iVar4);
    lVar1 = p_00->timeSat;
    lVar2 = pPat_00->timeTotalSave;
    aVar15 = Abc_Clock();
    Abc_PrintTimeP(1,"Sat ",lVar1 - lVar2,aVar15 - iVar4);
    lVar1 = p_00->timePat;
    lVar2 = pPat_00->timeTotalSave;
    aVar15 = Abc_Clock();
    Abc_PrintTimeP(1,"Pat ",lVar1 + lVar2,aVar15 - iVar4);
    aVar15 = Abc_Clock();
    Abc_PrintTime(1,"Time",(long)((int)aVar15 - iVar4));
  }
  pGVar14 = p_00->pAig;
  p_00->pAig = (Gia_Man_t *)0x0;
  if ((pGVar14 == (Gia_Man_t *)0x0) && (-1 < p_01->iOut)) {
    if (ParsSat.fVerbose == 0) {
      Abc_Print(1,"Disproved at least one output of the miter (zero-based number %d).\n",
                (ulong)(uint)p_01->iOut);
    }
    pPars->iOutFail = p_01->iOut;
  }
  else if ((p_01->pCexes != (void **)0x0) && (ParsSat.fVerbose == 0)) {
    Abc_Print(1,"Disproved %d outputs of the miter.\n",(ulong)(uint)p_01->nOuts);
  }
  if ((bVar3) && (ParsSat.fVerbose == 0)) {
    aVar15 = Abc_Clock();
    Abc_Print(1,"Timed out after %d seconds.\n",
              (long)(int)((double)aVar15 - (double)aVar13) / 1000000);
  }
  pAig->pCexComb = p_01->pCexComb;
  p_01->pCexComb = (Abc_Cex_t *)0x0;
  Cec_ManSimStop(p_01);
  Cec_ManPatStop(pPat_00);
  Cec_ManFraStop(p_00);
  return pGVar14;
}

Assistant:

Gia_Man_t * Cec_ManSatSweeping( Gia_Man_t * pAig, Cec_ParFra_t * pPars, int fSilent )
{
    int fOutputResult = 0;
    Cec_ParSat_t ParsSat, * pParsSat = &ParsSat;
    Cec_ParSim_t ParsSim, * pParsSim = &ParsSim;
    Gia_Man_t * pIni, * pSrm, * pTemp;
    Cec_ManFra_t * p;
    Cec_ManSim_t * pSim;
    Cec_ManPat_t * pPat;
    int i, fTimeOut = 0, nMatches = 0;
    abctime clk, clk2, clkTotal = Abc_Clock();

    // duplicate AIG and transfer equivalence classes
    Gia_ManRandom( 1 );
    pIni = Gia_ManDup(pAig);
    pIni->pReprs = pAig->pReprs; pAig->pReprs = NULL;
    pIni->pNexts = pAig->pNexts; pAig->pNexts = NULL;

    // prepare the managers
    // SAT sweeping
    p = Cec_ManFraStart( pIni, pPars );
    if ( pPars->fDualOut )
        pPars->fColorDiff = 1;
    // simulation
    Cec_ManSimSetDefaultParams( pParsSim );
    pParsSim->nWords      = pPars->nWords;
    pParsSim->nFrames     = pPars->nRounds;
    pParsSim->fCheckMiter = pPars->fCheckMiter;
    pParsSim->fDualOut    = pPars->fDualOut;
    pParsSim->fVerbose    = pPars->fVerbose;
    pSim = Cec_ManSimStart( p->pAig, pParsSim );
    // SAT solving
    Cec_ManSatSetDefaultParams( pParsSat );
    pParsSat->nBTLimit = pPars->nBTLimit;
    pParsSat->fVerbose = pPars->fVeryVerbose;
    // simulation patterns
    pPat = Cec_ManPatStart();
    pPat->fVerbose = pPars->fVeryVerbose;

    // start equivalence classes
clk = Abc_Clock();
    if ( p->pAig->pReprs == NULL )
    {
        if ( Cec_ManSimClassesPrepare(pSim, -1) || Cec_ManSimClassesRefine(pSim) )
        {
            Gia_ManStop( p->pAig );
            p->pAig = NULL;
            goto finalize;
        }
    }
p->timeSim += Abc_Clock() - clk;
    // perform solving
    for ( i = 1; i <= pPars->nItersMax; i++ )
    {
        clk2 = Abc_Clock();
        nMatches = 0;
        if ( pPars->fDualOut )
        {
            nMatches = Gia_ManEquivSetColors( p->pAig, pPars->fVeryVerbose );
//            p->pAig->pIso = Cec_ManDetectIsomorphism( p->pAig );
//            Gia_ManEquivTransform( p->pAig, 1 );
        }
        pSrm = Cec_ManFraSpecReduction( p ); 

//        Gia_AigerWrite( pSrm, "gia_srm.aig", 0, 0 );

        if ( pPars->fVeryVerbose )
            Gia_ManPrintStats( pSrm, NULL );
        if ( Gia_ManCoNum(pSrm) == 0 )
        {
            Gia_ManStop( pSrm );
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Considered all available candidate equivalences.\n" );
            if ( pPars->fDualOut && Gia_ManAndNum(p->pAig) > 0 )
            {
                if ( pPars->fColorDiff )
                {
                    if ( p->pPars->fVerbose )
                        Abc_Print( 1, "Switching into reduced mode.\n" );
                    pPars->fColorDiff = 0;
                }
                else
                {
                    if ( p->pPars->fVerbose )
                        Abc_Print( 1, "Switching into normal mode.\n" );
                    pPars->fDualOut = 0;
                }
                continue;
            }
            break;
        }
clk = Abc_Clock();
        if ( pPars->fRunCSat )
            Cec_ManSatSolveCSat( pPat, pSrm, pParsSat ); 
        else
            Cec_ManSatSolve( pPat, pSrm, pParsSat ); 
p->timeSat += Abc_Clock() - clk;
        if ( Cec_ManFraClassesUpdate( p, pSim, pPat, pSrm ) )
        {
            Gia_ManStop( pSrm );
            Gia_ManStop( p->pAig );
            p->pAig = NULL;
            goto finalize;
        }
        Gia_ManStop( pSrm );

        // update the manager
        pSim->pAig = p->pAig = Gia_ManEquivReduceAndRemap( pTemp = p->pAig, 0, pParsSim->fDualOut );
        if ( p->pAig == NULL )
        {
            p->pAig = pTemp;
            break;
        }
        Gia_ManStop( pTemp );
        if ( p->pPars->fVerbose )
        {
            Abc_Print( 1, "%3d : P =%7d. D =%7d. F =%6d. M = %7d. And =%8d. ", 
                i, p->nAllProved, p->nAllDisproved, p->nAllFailed, nMatches, Gia_ManAndNum(p->pAig) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk2 );
        }
        if ( Gia_ManAndNum(p->pAig) == 0 )
        {
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Network after reduction is empty.\n" );
            break;
        }
        // check resource limits
        if ( p->pPars->TimeLimit && (Abc_Clock() - clkTotal)/CLOCKS_PER_SEC >= p->pPars->TimeLimit )
        {
            fTimeOut = 1;
            break;
        }
//        if ( p->nAllFailed && !p->nAllProved && !p->nAllDisproved )
        if ( p->nAllFailed > p->nAllProved + p->nAllDisproved )
        {
            if ( pParsSat->nBTLimit >= 10001 )
                break;
            if ( pPars->fSatSweeping )
            {
                if ( p->pPars->fVerbose )
                    Abc_Print( 1, "Exceeded the limit on the number of conflicts (%d).\n", pParsSat->nBTLimit );
                break;
            }
            pParsSat->nBTLimit *= 10;
            if ( p->pPars->fVerbose )
            {
                if ( p->pPars->fVerbose )
                    Abc_Print( 1, "Increasing conflict limit to %d.\n", pParsSat->nBTLimit );
                if ( fOutputResult )
                {
                    Gia_AigerWrite( p->pAig, "gia_cec_temp.aig", 0, 0 );
                    Abc_Print( 1,"The result is written into file \"%s\".\n", "gia_cec_temp.aig" );
                }
            }
        }
        if ( pPars->fDualOut && pPars->fColorDiff && (Gia_ManAndNum(p->pAig) < 100000 || p->nAllProved + p->nAllDisproved < 10) )
        {
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Switching into reduced mode.\n" );
            pPars->fColorDiff = 0;
        }
//        if ( pPars->fDualOut && Gia_ManAndNum(p->pAig) < 20000 )
        else if ( pPars->fDualOut && (Gia_ManAndNum(p->pAig) < 20000 || p->nAllProved + p->nAllDisproved < 10) )
        {
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Switching into normal mode.\n" );
            pPars->fColorDiff = 0;
            pPars->fDualOut = 0;
        }
    }
finalize:
    if ( p->pPars->fVerbose && p->pAig )
    {
        Abc_Print( 1, "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n", 
            Gia_ManAndNum(pAig), Gia_ManAndNum(p->pAig), 
            100.0*(Gia_ManAndNum(pAig)-Gia_ManAndNum(p->pAig))/(Gia_ManAndNum(pAig)?Gia_ManAndNum(pAig):1), 
            Gia_ManRegNum(pAig), Gia_ManRegNum(p->pAig), 
            100.0*(Gia_ManRegNum(pAig)-Gia_ManRegNum(p->pAig))/(Gia_ManRegNum(pAig)?Gia_ManRegNum(pAig):1) );
        Abc_PrintTimeP( 1, "Sim ", p->timeSim, Abc_Clock() - (int)clkTotal );
        Abc_PrintTimeP( 1, "Sat ", p->timeSat-pPat->timeTotalSave, Abc_Clock() - (int)clkTotal );
        Abc_PrintTimeP( 1, "Pat ", p->timePat+pPat->timeTotalSave, Abc_Clock() - (int)clkTotal );
        Abc_PrintTime( 1, "Time", (int)(Abc_Clock() - clkTotal) );
    }

    pTemp = p->pAig; p->pAig = NULL;
    if ( pTemp == NULL && pSim->iOut >= 0 )
    {
        if ( !fSilent )
        Abc_Print( 1, "Disproved at least one output of the miter (zero-based number %d).\n", pSim->iOut );
        pPars->iOutFail = pSim->iOut;
    }
    else if ( pSim->pCexes && !fSilent )
        Abc_Print( 1, "Disproved %d outputs of the miter.\n", pSim->nOuts );
    if ( fTimeOut && !fSilent )
        Abc_Print( 1, "Timed out after %d seconds.\n", (int)((double)Abc_Clock() - clkTotal)/CLOCKS_PER_SEC );

    pAig->pCexComb = pSim->pCexComb; pSim->pCexComb = NULL;
    Cec_ManSimStop( pSim );
    Cec_ManPatStop( pPat );
    Cec_ManFraStop( p );
    return pTemp;
}